

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx2_mula2(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  __m256i counters [16];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar13 = ZEXT1664((undefined1  [16])0x0);
  local_c0 = vmovdqa64_avx512f(auVar13);
  local_100 = vmovdqa64_avx512f(auVar13);
  local_140 = vmovdqa64_avx512f(auVar13);
  local_180 = vmovdqa64_avx512f(auVar13);
  local_1c0 = vmovdqa64_avx512f(auVar13);
  local_200 = vmovdqa64_avx512f(auVar13);
  local_240 = vmovdqa64_avx512f(auVar13);
  local_280 = vmovdqa64_avx512f(auVar13);
  uVar4 = (ulong)len;
  if (len < 0x10) {
    uVar8 = 0;
  }
  else {
    auVar9._8_2_ = 1;
    auVar9._0_8_ = 0x1000100010001;
    auVar9._10_2_ = 1;
    auVar9._12_2_ = 1;
    auVar9._14_2_ = 1;
    auVar9._16_2_ = 1;
    auVar9._18_2_ = 1;
    auVar9._20_2_ = 1;
    auVar9._22_2_ = 1;
    auVar9._24_2_ = 1;
    auVar9._26_2_ = 1;
    auVar9._28_2_ = 1;
    auVar9._30_2_ = 1;
    uVar7 = 0;
    uVar5 = 0x10;
    do {
      uVar8 = uVar5;
      auVar14 = *(undefined1 (*) [32])(array + uVar7);
      lVar6 = 0;
      do {
        auVar3 = vpand_avx2(auVar14,auVar9);
        auVar3 = vpaddw_avx2(auVar3,*(undefined1 (*) [32])(local_280 + lVar6));
        *(undefined1 (*) [32])(local_280 + lVar6) = auVar3;
        auVar14 = vpsrlw_avx2(auVar14,1);
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x200);
      uVar7 = uVar8;
      uVar5 = uVar8 + 0x10;
    } while (uVar8 + 0x10 <= uVar4);
  }
  if (uVar8 < uVar4) {
    auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar10 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar11 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar12 = vpbroadcastd_avx512f();
      auVar12 = vpsrlvd_avx512f(auVar12,auVar10);
      auVar12 = vpandd_avx512f(auVar12,auVar11);
      auVar13 = vpaddd_avx512f(auVar12,auVar13);
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
    auVar13 = vmovdqu64_avx512f(auVar13);
    *(undefined1 (*) [64])flags = auVar13;
  }
  lVar6 = 0;
  do {
    auVar13 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_280 + lVar6 * 8));
    auVar13 = vpaddd_avx512f(ZEXT464(*(uint *)((long)flags + lVar6)),auVar13);
    auVar9 = vextracti64x4_avx512f(auVar13,1);
    auVar13 = vpaddd_avx512f(auVar13,ZEXT3264(auVar9));
    auVar1 = vpaddd_avx(auVar13._0_16_,auVar13._16_16_);
    auVar2 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddd_avx(auVar1,auVar2);
    auVar2 = vpshufd_avx(auVar1,0x55);
    auVar1 = vpaddd_avx(auVar1,auVar2);
    *(int *)((long)flags + lVar6) = auVar1._0_4_;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x40);
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_mula2(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m256i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm256_setzero_si256();
    }

    size_t i = 0;
    for (/**/; i + 16 <= len; i += 16) {
        __m256i input = _mm256_loadu_si256((__m256i*)(array + i));

        for (int j = 0; j < 16; ++j) {
            __m256i bit = _mm256_and_si256(input, _mm256_set1_epi16(1));
            counters[j] = _mm256_add_epi16(counters[j], bit);
            input = _mm256_srli_epi16(input, 1);
        }
    }

     // residual
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    uint16_t tmp[16];
    for (size_t i = 0; i < 16; ++i) {
        _mm256_storeu_si256((__m256i*)tmp, counters[i]);
        for (int j=0; j < 16; ++j)
            flags[i] += tmp[j];
    }
    return 0;
}